

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_comment.cpp
# Opt level: O0

void __thiscall Comment_BashInsideArray_Test::TestBody(Comment_BashInsideArray_Test *this)

{
  bool bVar1;
  MockSpec<std::error_code_()> *pMVar2;
  TypedExpectation<std::error_code_()> *pTVar3;
  MockSpec<std::error_code_(unsigned_long)> *this_00;
  TypedExpectation<std::error_code_(unsigned_long)> *this_01;
  parser<callbacks_proxy<mock_json_callbacks>_> *this_02;
  Message *pMVar4;
  error_code *this_03;
  char *message;
  extensions extensions;
  mock_json_callbacks *in_RSI;
  mock_json_callbacks *this_04;
  StrictMock<mock_json_callbacks> *this_05;
  char *in_R9;
  string local_1b0;
  AssertHelper local_190;
  string local_188;
  Message local_168;
  bool local_159;
  undefined1 local_158 [8];
  AssertionResult gtest_ar_;
  undefined1 local_128 [8];
  parser<callbacks_proxy<mock_json_callbacks>_> p;
  MockSpec<std::error_code_()> local_80;
  WithoutMatchers local_6d [13];
  Matcher<unsigned_long> local_60;
  MockSpec<std::error_code_(unsigned_long)> local_48;
  WithoutMatchers local_21;
  MockSpec<std::error_code_()> local_20;
  Comment_BashInsideArray_Test *local_10;
  Comment_BashInsideArray_Test *this_local;
  
  this_05 = &(this->super_Comment).callbacks_;
  local_10 = this;
  local_20.function_mocker_ =
       (FunctionMocker<std::error_code_()> *)
       mock_json_callbacks::gmock_begin_array((MockSpec<std::error_code_()> *)this_05,in_RSI);
  testing::internal::GetWithoutMatchers();
  pMVar2 = testing::internal::MockSpec<std::error_code_()>::operator()
                     (&local_20,&local_21,(void *)0x0);
  pTVar3 = testing::internal::MockSpec<std::error_code_()>::InternalExpectedAt
                     (pMVar2,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_comment.cpp"
                      ,0x45,"callbacks_","begin_array ()");
  testing::internal::TypedExpectation<std::error_code_()>::Times(pTVar3,1);
  testing::Matcher<unsigned_long>::Matcher<testing::internal::AnythingMatcher_const&,void>
            (&local_60,(AnythingMatcher *)&testing::_);
  mock_json_callbacks::gmock_uint64_value(&local_48,&this_05->super_mock_json_callbacks,&local_60);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<std::error_code_(unsigned_long)>::operator()
                      (&local_48,local_6d,(void *)0x0);
  this_01 = testing::internal::MockSpec<std::error_code_(unsigned_long)>::InternalExpectedAt
                      (this_00,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_comment.cpp"
                       ,0x46,"callbacks_","uint64_value (_)");
  this_04 = (mock_json_callbacks *)0x2;
  testing::internal::TypedExpectation<std::error_code_(unsigned_long)>::Times(this_01,2);
  testing::internal::MockSpec<std::error_code_(unsigned_long)>::~MockSpec(&local_48);
  testing::Matcher<unsigned_long>::~Matcher(&local_60);
  local_80.function_mocker_ =
       (FunctionMocker<std::error_code_()> *)
       mock_json_callbacks::gmock_end_array
                 ((MockSpec<std::error_code_()> *)&(this->super_Comment).callbacks_,this_04);
  testing::internal::GetWithoutMatchers();
  pMVar2 = testing::internal::MockSpec<std::error_code_()>::operator()
                     (&local_80,(WithoutMatchers *)((long)&p.coordinate_.row + 3),(void *)0x0);
  extensions = 0x1effd7;
  pTVar3 = testing::internal::MockSpec<std::error_code_()>::InternalExpectedAt
                     (pMVar2,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_comment.cpp"
                      ,0x47,"callbacks_","end_array ()");
  testing::internal::TypedExpectation<std::error_code_()>::Times(pTVar3,1);
  pstore::json::make_parser<callbacks_proxy<mock_json_callbacks>>
            ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_128,
             (json *)&(this->super_Comment).proxy_,(callbacks_proxy<mock_json_callbacks> *)0x1,
             extensions);
  s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &gtest_ar_.message_,"[#comment\n1,     # comment containing #\n2 # comment\n]\n",0x36
              );
  this_02 = pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::input
                      ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_128,
                       (string *)&gtest_ar_.message_);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::eof(this_02);
  std::__cxx11::string::~string((string *)&gtest_ar_.message_);
  local_159 = pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::has_error
                        ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_128);
  local_159 = !local_159;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_158,&local_159,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
  if (!bVar1) {
    testing::Message::Message(&local_168);
    pMVar4 = testing::Message::operator<<(&local_168,(char (*) [17])"JSON error was: ");
    this_03 = pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::last_error
                        ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_128);
    std::error_code::message_abi_cxx11_(&local_188,this_03);
    pMVar4 = testing::Message::operator<<(pMVar4,&local_188);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1b0,(internal *)local_158,(AssertionResult *)"p.has_error ()","true","false",
               in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_comment.cpp"
               ,0x50,message);
    testing::internal::AssertHelper::operator=(&local_190,pMVar4);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_188);
    testing::Message::~Message(&local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::~parser
            ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_128);
  return;
}

Assistant:

TEST_F (Comment, BashInsideArray) {
    using testing::_;
    EXPECT_CALL (callbacks_, begin_array ()).Times (1);
    EXPECT_CALL (callbacks_, uint64_value (_)).Times (2);
    EXPECT_CALL (callbacks_, end_array ()).Times (1);

    json::parser<decltype (proxy_)> p = json::make_parser (proxy_, json::extensions::bash_comments);
    p.input (R"([#comment
1,     # comment containing #
2 # comment
]
)"s)
        .eof ();
    EXPECT_FALSE (p.has_error ()) << "JSON error was: " << p.last_error ().message ();
}